

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes3.cc
# Opt level: O2

string * __thiscall
Node::OutputDefinitionParams_abi_cxx11_
          (string *__return_storage_ptr__,Node *this,Node *MainType,int ExtType,int GlobalStat)

{
  ostream *poVar1;
  int FunctionFlag;
  int extraout_EDX;
  Node *extraout_RDX;
  Node *extraout_RDX_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_68;
  string local_48;
  Node *pNVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (this->Type == 0x1d9) {
    pNVar2 = MainType;
    if (this->Tree[1] != (Node *)0x0) {
      OutputNodeVarType_abi_cxx11_(&local_48,this->Tree[1]);
      std::operator+(&bStack_68,&local_48," ");
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&bStack_68);
      std::__cxx11::string::~string((string *)&local_48);
      pNVar2 = extraout_RDX_00;
    }
    if (this->Tree[3] != (Node *)0x0) {
      OutputPassmech_abi_cxx11_(&bStack_68,this->Tree[3],(int)pNVar2);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&bStack_68);
    }
    OutputVarName_abi_cxx11_(&bStack_68,this->Tree[0],this->Tree[2],1);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&bStack_68);
    if (this->Tree[4] != (Node *)0x0) {
      Expression_abi_cxx11_(&local_48,this->Tree[4]);
      std::operator+(&bStack_68," = ",&local_48);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&bStack_68);
      std::__cxx11::string::~string((string *)&local_48);
    }
    if (this->Block[0] == (Node *)0x0) {
      return __return_storage_ptr__;
    }
    OutputDefinitionParams_abi_cxx11_(&local_48,this->Block[0],MainType,ExtType,GlobalStat);
    std::operator+(&bStack_68,", ",&local_48);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
  }
  else if (this->Type == 0x1d8) {
    pNVar2 = MainType;
    if (GlobalStat == 1) {
      std::__cxx11::string::assign((char *)__return_storage_ptr__);
      pNVar2 = extraout_RDX;
    }
    FunctionFlag = (int)pNVar2;
    if (this->Tree[1] != (Node *)0x0) {
      OutputNodeVarType_abi_cxx11_(&local_48,this->Tree[1]);
      std::operator+(&bStack_68,&local_48," ");
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&bStack_68);
      std::__cxx11::string::~string((string *)&local_48);
      FunctionFlag = extraout_EDX;
    }
    if (this->Tree[3] != (Node *)0x0) {
      OutputPassmech_abi_cxx11_(&bStack_68,this->Tree[3],FunctionFlag);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&bStack_68);
    }
    if (this->Tree[0] != (Node *)0x0) {
      OutputVarName_abi_cxx11_(&bStack_68,this->Tree[0],this->Tree[2],1);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&bStack_68);
    }
    if (this->Tree[4] != (Node *)0x0) {
      Expression_abi_cxx11_(&local_48,this->Tree[4]);
      std::operator+(&bStack_68," = ",&local_48);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&bStack_68);
      std::__cxx11::string::~string((string *)&local_48);
    }
    if (this->Block[0] == (Node *)0x0) {
      return __return_storage_ptr__;
    }
    OutputDefinitionParams_abi_cxx11_(&local_48,this->Block[0],MainType,ExtType,GlobalStat);
    std::operator+(&bStack_68,", ",&local_48);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
  }
  else {
    poVar1 = std::operator<<((ostream *)&std::cerr,
                             "Something isn\'t using BAS_V_DEFINE??? (default) @ ");
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,this->lineno);
    std::endl<char,std::char_traits<char>>(poVar1);
    OutputDefinition_abi_cxx11_(&local_48,this,MainType,ExtType);
    std::operator+(&bStack_68,"const ",&local_48);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
  }
  std::__cxx11::string::~string((string *)&bStack_68);
  std::__cxx11::string::~string((string *)&local_48);
  return __return_storage_ptr__;
}

Assistant:

std::string Node::OutputDefinitionParams(
	Node* MainType,		/**< Main data type */
	int ExtType,		/**< Extra data type */
	int GlobalStat		/**< Global status */
)
{
	std::string result;

	switch(Type)
	{
	case BAS_V_DEFINEVAR:
		switch(GlobalStat)
		{
		case 1:		// Constant definition
			result = "const ";
			break;
		}

		if (Tree[1] != 0)
		{
			result += Tree[1]->OutputNodeVarType() + " ";
		}
		if (Tree[3] != 0)
		{
			result += Tree[3]->OutputPassmech(0);
		}
		if (Tree[0] != 0)
		{
			result += Tree[0]->OutputVarName(Tree[2], 1);
		}
		if (Tree[4] != 0)
		{
			result += " = " + Tree[4]->Expression();
		}

		if (Block[0] != 0)
		{
			result += ", " +
				Block[0]->OutputDefinitionParams(MainType, ExtType, GlobalStat);
		}
		break;

	case BAS_V_DEFINEFUN:
		if (Tree[1] != 0)
		{
			result += Tree[1]->OutputNodeVarType() + " ";
		}
		if (Tree[3] != 0)
		{
			result += Tree[3]->OutputPassmech(1);
		}
		result += Tree[0]->OutputVarName(Tree[2], 1);
		if (Tree[4] != 0)
		{
			result += " = " + Tree[4]->Expression();
		}
		if (Block[0] != 0)
		{
			result += ", " +
					Block[0]->OutputDefinitionParams(MainType, ExtType, GlobalStat);
		}
		break;

	default:
std::cerr << "Something isn't using BAS_V_DEFINE??? (default) @ " << lineno << std::endl;
		result += "const " + OutputDefinition(MainType, ExtType);
		break;
	}

	return result;
}